

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-name-number-tree.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long *plVar6;
  undefined8 extraout_RAX;
  element_type *peVar7;
  uint uVar8;
  int iVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle QVar15;
  QPDFObjectHandle QVar16;
  QPDFNumberTreeObjectHelper number_tree;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_410 [4];
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8 [5];
  QPDF qpdf;
  iterator iter2;
  iterator iter;
  QPDFObjectHandle obj;
  QPDFNameTreeObjectHelper name_tree;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_2e8 [3];
  iterator __end1_3;
  QPDFObjectHandle example;
  QPDFObjectHandle names;
  QPDFObjectHandle name_tree_oh;
  QPDFObjectHandle number_tree_oh;
  string local_238 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  string local_228 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  string local_218 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  string local_208 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  string local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  string local_1e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  QPDFObjectHandle root;
  string local_1c8;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  iterator local_198;
  iterator local_150;
  iterator local_108;
  iterator local_c0;
  iterator local_78;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    pcVar1 = argv[1];
    QPDF::QPDF(&qpdf);
    QPDF::emptyPDF();
    QPDF::getRoot();
    QPDFObjectHandle::newDictionary();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"/Example",(allocator<char> *)&number_tree);
    QPDFObjectHandle::replaceKey((string *)&root,(QPDFObjectHandle *)&iter);
    std::__cxx11::string::~string((string *)&iter);
    QPDFNameTreeObjectHelper::newEmpty((QPDF *)&name_tree,SUB81(&qpdf,0));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&name_tree_oh,local_2e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"/NameTree",(allocator<char> *)&number_tree);
    QPDFObjectHandle::replaceKey((string *)&example,(QPDFObjectHandle *)&iter);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"K",(allocator<char> *)&iter2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"king",(allocator<char> *)&w);
    QPDFObjectHandle::newUnicodeString(local_1e8);
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter;
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&name_tree;
    QPDFNameTreeObjectHelper::insert((string *)&local_78,QVar10);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"Q",(allocator<char> *)&iter2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"queen",(allocator<char> *)&w);
    QPDFObjectHandle::newUnicodeString(local_1f8);
    QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter;
    QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&name_tree;
    QPDFNameTreeObjectHelper::insert((string *)&local_c0,QVar11);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"R",(allocator<char> *)&iter2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"rook",(allocator<char> *)&w);
    QPDFObjectHandle::newUnicodeString(local_208);
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter;
    QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&name_tree;
    QPDFNameTreeObjectHelper::insert((string *)&local_108,QVar12);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"B",(allocator<char> *)&iter2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"bishop",(allocator<char> *)&w);
    QPDFObjectHandle::newUnicodeString(local_218);
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter;
    QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&name_tree;
    QPDFNameTreeObjectHelper::insert((string *)&local_150,QVar13);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_150);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter,"N",(allocator<char> *)&iter2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"knight",(allocator<char> *)&w);
    QPDFObjectHandle::newUnicodeString(local_228);
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&iter;
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&name_tree;
    QPDFNameTreeObjectHelper::insert((string *)&local_198,QVar14);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::~string((string *)&iter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"P",(allocator<char> *)&w);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter2,"pawn",(allocator<char> *)&__end1_3);
    QPDFObjectHandle::newUnicodeString(local_238);
    QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&number_tree;
    QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&name_tree;
    QPDFNameTreeObjectHelper::insert((string *)&iter,QVar15);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
    std::__cxx11::string::~string((string *)&iter2);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"just inserted ");
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar3 = std::operator<<(poVar3,psVar4);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::operator--(&iter);
    poVar3 = std::operator<<((ostream *)&std::cout,"predecessor: ");
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar3 = std::operator<<(poVar3,psVar4);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::operator++(&iter);
    QPDFNameTreeObjectHelper::iterator::operator++(&iter);
    poVar3 = std::operator<<((ostream *)&std::cout,"successor: ");
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar3 = std::operator<<(poVar3,psVar4);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Name tree items:");
    std::endl<char,std::char_traits<char>>(poVar3);
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    while( true ) {
      bVar2 = QPDFNameTreeObjectHelper::iterator::operator!=
                        ((iterator *)&number_tree,(iterator *)&iter2);
      if (!bVar2) break;
      ppVar5 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
      ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)&w,ppVar5);
      poVar3 = std::operator<<((ostream *)&std::cout,"  ");
      poVar3 = std::operator<<(poVar3,(string *)&w);
      poVar3 = std::operator<<(poVar3," -> ");
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,(string *)&__end1_3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&__end1_3);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
               *)&w);
      QPDFNameTreeObjectHelper::iterator::operator++((iterator *)&number_tree);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&iter2);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Keys in name tree object:");
    std::endl<char,std::char_traits<char>>(poVar3);
    names.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    names.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QPDFObjectHandle::ditems();
    QPDFObjectHandle::QPDFDictItems::begin();
    QPDFObjectHandle::QPDFDictItems::end();
    while( true ) {
      bVar2 = QPDFObjectHandle::QPDFDictItems::iterator::operator!=
                        ((iterator *)&number_tree,(iterator *)&iter2);
      if (!bVar2) break;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar2 = std::operator==(__lhs,"/Names");
      if (bVar2) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&names,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(__lhs + 1));
      }
      QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)&number_tree);
    }
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&iter2);
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)&number_tree);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3c8);
    poVar3 = std::operator<<((ostream *)&std::cout,"Values in names:");
    std::endl<char,std::char_traits<char>>(poVar3);
    QPDFObjectHandle::aitems();
    QPDFObjectHandle::QPDFArrayItems::begin();
    QPDFObjectHandle::QPDFArrayItems::end();
    while( true ) {
      bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                        ((iterator *)&number_tree,(iterator *)&iter2);
      if (!bVar2) break;
      QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)&number_tree);
      poVar3 = std::operator<<((ostream *)&std::cout,"  ");
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,(string *)&w);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&w);
      QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&number_tree);
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&iter2);
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&number_tree);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end1_3.impl);
    poVar3 = std::operator<<((ostream *)&std::cout,"Has Q?: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"Q",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::hasName((string *)&name_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Has W?: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"W",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::hasName((string *)&name_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    poVar3 = std::operator<<((ostream *)&std::cout,"Found W?: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"W",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::findObject((string *)&name_tree,(QPDFObjectHandle *)&number_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Found Q?: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"Q",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::findObject((string *)&name_tree,(QPDFObjectHandle *)&number_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Q: ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::string<std::allocator<char>>((string *)&iter2,"Q",(allocator<char> *)&w);
    QPDFNameTreeObjectHelper::find((string *)&number_tree,SUB81(&name_tree,0));
    QPDFNameTreeObjectHelper::iterator::operator=(&iter,(iterator *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&number_tree);
    std::__cxx11::string::~string((string *)&iter2);
    poVar3 = std::operator<<((ostream *)&std::cout,"Q: ");
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar3 = std::operator<<(poVar3,psVar4);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::string<std::allocator<char>>((string *)&iter2,"W",(allocator<char> *)&w);
    QPDFNameTreeObjectHelper::find((string *)&number_tree,SUB81(&name_tree,0));
    QPDFNameTreeObjectHelper::iterator::operator=(&iter,(iterator *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&number_tree);
    std::__cxx11::string::~string((string *)&iter2);
    poVar3 = std::operator<<((ostream *)&std::cout,"W found: ");
    QPDFNameTreeObjectHelper::end();
    QPDFNameTreeObjectHelper::iterator::operator!=(&iter,(iterator *)&number_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&number_tree);
    std::__cxx11::string::string<std::allocator<char>>((string *)&iter2,"W",(allocator<char> *)&w);
    QPDFNameTreeObjectHelper::find((string *)&number_tree,SUB81(&name_tree,0));
    QPDFNameTreeObjectHelper::iterator::operator=(&iter,(iterator *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&number_tree);
    std::__cxx11::string::~string((string *)&iter2);
    poVar3 = std::operator<<((ostream *)&std::cout,"W\'s predecessor: ");
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar3 = std::operator<<(poVar3,psVar4);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Remove P: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"P",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::remove((string *)&name_tree,(QPDFObjectHandle *)&number_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Value removed: ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Has P?: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"P",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::hasName((string *)&name_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    std::__cxx11::string::string<std::allocator<char>>((string *)&iter2,"K",(allocator<char> *)&w);
    QPDFNameTreeObjectHelper::find((string *)&number_tree,SUB81(&name_tree,0));
    QPDFNameTreeObjectHelper::iterator::operator=(&iter,(iterator *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&number_tree);
    std::__cxx11::string::~string((string *)&iter2);
    poVar3 = std::operator<<((ostream *)&std::cout,"Find K: ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    QPDFNameTreeObjectHelper::iterator::remove();
    poVar3 = std::operator<<((ostream *)&std::cout,"Iter after removing K: ");
    psVar4 = (string *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    poVar3 = std::operator<<(poVar3,psVar4);
    poVar3 = std::operator<<(poVar3," -> ");
    QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&number_tree);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    poVar3 = std::operator<<((ostream *)&std::cout,"Has K?: ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&number_tree,"K",(allocator<char> *)&iter2);
    QPDFNameTreeObjectHelper::hasName((string *)&name_tree);
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&number_tree);
    QPDFNumberTreeObjectHelper::newEmpty((QPDF *)&number_tree,SUB81(&qpdf,0));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&number_tree_oh,local_410);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iter2,"/NumberTree",(allocator<char> *)&w);
    QPDFObjectHandle::replaceKey((string *)&example,(QPDFObjectHandle *)&iter2);
    std::__cxx11::string::~string((string *)&iter2);
    QPDFNumberTreeObjectHelper::begin();
    for (peVar7 = (element_type *)0x7; peVar7 < (element_type *)0x15f; peVar7 = peVar7 + 7) {
      std::__cxx11::to_string(&local_1c8,(int)peVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1_3,
                     "-",&local_1c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&w,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1_3,
                     "-");
      QPDFObjectHandle::newString((string *)local_1a8);
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8;
      QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar7;
      QPDFNumberTreeObjectHelper::iterator::insertAfter((longlong)&iter2,QVar16);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0);
      std::__cxx11::string::~string((string *)&w);
      std::__cxx11::string::~string((string *)&__end1_3);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Numbers:");
    std::endl<char,std::char_traits<char>>(poVar3);
    QPDFNumberTreeObjectHelper::begin();
    QPDFNumberTreeObjectHelper::end();
    iVar9 = -1;
    uVar8 = 1;
    while( true ) {
      bVar2 = QPDFNumberTreeObjectHelper::iterator::operator!=((iterator *)&w,&__end1_3);
      if (!bVar2) break;
      QPDFNumberTreeObjectHelper::iterator::operator*((iterator *)&w);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      poVar3 = std::operator<<(poVar3," -> ");
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      std::operator<<(poVar3,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if ((uVar8 / 5) * 5 + iVar9 == 0) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      else {
        std::operator<<((ostream *)&std::cout,", ");
      }
      uVar8 = uVar8 + 1;
      iVar9 = iVar9 + -1;
      QPDFNumberTreeObjectHelper::iterator::operator++((iterator *)&w);
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator(&__end1_3);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
    QPDFNumberTreeObjectHelper::begin();
    QPDFNumberTreeObjectHelper::iterator::operator=(&iter2,(iterator *)&w);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
    while( true ) {
      QPDFNumberTreeObjectHelper::end();
      bVar2 = QPDFNumberTreeObjectHelper::iterator::operator!=(&iter2,(iterator *)&w);
      QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
      if (!bVar2) break;
      plVar6 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&iter2);
      if (*plVar6 % 5 == 0) {
        QPDFNumberTreeObjectHelper::iterator::remove();
      }
      else {
        QPDFNumberTreeObjectHelper::iterator::operator++(&iter2);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Numbers after filtering:");
    std::endl<char,std::char_traits<char>>(poVar3);
    QPDFNumberTreeObjectHelper::begin();
    QPDFNumberTreeObjectHelper::end();
    uVar8 = 1;
    iVar9 = -1;
    while( true ) {
      bVar2 = QPDFNumberTreeObjectHelper::iterator::operator!=((iterator *)&w,&__end1_3);
      if (!bVar2) break;
      QPDFNumberTreeObjectHelper::iterator::operator*((iterator *)&w);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      poVar3 = std::operator<<(poVar3," -> ");
      QPDFObjectHandle::getUTF8Value_abi_cxx11_();
      std::operator<<(poVar3,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if ((uVar8 / 5) * 5 + iVar9 == 0) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      else {
        std::operator<<((ostream *)&std::cout,", ");
      }
      uVar8 = uVar8 + 1;
      iVar9 = iVar9 + -1;
      QPDFNumberTreeObjectHelper::iterator::operator++((iterator *)&w);
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator(&__end1_3);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
    QPDFWriter::QPDFWriter(&w,&qpdf,pcVar1);
    QPDFWriter::setQDFMode(SUB81(&w,0));
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3c8);
    QPDFNumberTreeObjectHelper::iterator::~iterator(&iter2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&number_tree_oh.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(&number_tree);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&names.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFNameTreeObjectHelper::iterator::~iterator(&iter);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&name_tree_oh.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&name_tree);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&example.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDF::~QPDF(&qpdf);
    return 0;
  }
  usage();
  QPDFNumberTreeObjectHelper::iterator::~iterator(&iter2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&number_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(&number_tree);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&names.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFNameTreeObjectHelper::iterator::~iterator(&iter);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&name_tree_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&name_tree);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&example.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDF::~QPDF(&qpdf);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 2) {
        usage();
    }

    char const* outfilename = argv[1];

    QPDF qpdf;
    qpdf.emptyPDF();

    // This example doesn't do anything particularly useful other than just illustrate how to use
    // the APIs for name and number trees. It also demonstrates use of the iterators for
    // dictionaries and arrays introduced at the same time with qpdf 10.2.

    // To use this example, compile it and run it. Study the output and compare it to what you
    // expect. When done, look at the generated output file in a text editor to inspect the
    // structure of the trees as left in the file.

    // We're just going to create some name and number trees, hang them off the document catalog
    // (root), and write an empty PDF to a file. The PDF will have no pages and won't be viewable,
    // but you can look at it in a text editor to see the resulting structure of the PDF.

    // Create a dictionary off the root where we will hang our name and number trees.
    auto root = qpdf.getRoot();
    auto example = QPDFObjectHandle::newDictionary();
    root.replaceKey("/Example", example);

    // Create a name tree, attach it to the file, and add some items.
    auto name_tree = QPDFNameTreeObjectHelper::newEmpty(qpdf);
    auto name_tree_oh = name_tree.getObjectHandle();
    example.replaceKey("/NameTree", name_tree_oh);
    name_tree.insert("K", QPDFObjectHandle::newUnicodeString("king"));
    name_tree.insert("Q", QPDFObjectHandle::newUnicodeString("queen"));
    name_tree.insert("R", QPDFObjectHandle::newUnicodeString("rook"));
    name_tree.insert("B", QPDFObjectHandle::newUnicodeString("bishop"));
    name_tree.insert("N", QPDFObjectHandle::newUnicodeString("knight"));
    auto iter = name_tree.insert("P", QPDFObjectHandle::newUnicodeString("pawn"));
    // Look at the iterator
    std::cout << "just inserted " << iter->first << " -> " << iter->second.unparse() << std::endl;
    --iter;
    std::cout << "predecessor: " << iter->first << " -> " << iter->second.unparse() << std::endl;
    ++iter;
    ++iter;
    std::cout << "successor: " << iter->first << " -> " << iter->second.unparse() << std::endl;

    // Use range-for iteration
    std::cout << "Name tree items:" << std::endl;
    for (auto i: name_tree) {
        std::cout << "  " << i.first << " -> " << i.second.unparse() << std::endl;
    }

    // This is a small tree, so everything will be at the root. We can look at it using dictionary
    // and array iterators.
    std::cout << "Keys in name tree object:" << std::endl;
    QPDFObjectHandle names;
    for (auto const& i: name_tree_oh.ditems()) {
        std::cout << i.first << std::endl;
        if (i.first == "/Names") {
            names = i.second;
        }
    }
    // Values in names array:
    std::cout << "Values in names:" << std::endl;
    for (auto& i: names.aitems()) {
        std::cout << "  " << i.unparse() << std::endl;
    }

    // pre 10.2 API
    std::cout << "Has Q?: " << name_tree.hasName("Q") << std::endl;
    std::cout << "Has W?: " << name_tree.hasName("W") << std::endl;
    QPDFObjectHandle obj;
    std::cout << "Found W?: " << name_tree.findObject("W", obj) << std::endl;
    std::cout << "Found Q?: " << name_tree.findObject("Q", obj) << std::endl;
    std::cout << "Q: " << obj.unparse() << std::endl;

    // 10.2 API
    iter = name_tree.find("Q");
    std::cout << "Q: " << iter->first << " -> " << iter->second.unparse() << std::endl;
    iter = name_tree.find("W");
    std::cout << "W found: " << (iter != name_tree.end()) << std::endl;
    // Allow find to return predecessor
    iter = name_tree.find("W", true);
    std::cout << "W's predecessor: " << iter->first << " -> " << iter->second.unparse()
              << std::endl;

    // We can also remove items
    std::cout << "Remove P: " << name_tree.remove("P", &obj) << std::endl;
    std::cout << "Value removed: " << obj.unparse() << std::endl;
    std::cout << "Has P?: " << name_tree.hasName("P") << std::endl;
    // Or we can remove using an iterator
    iter = name_tree.find("K");
    std::cout << "Find K: " << iter->second.unparse() << std::endl;
    iter.remove();
    std::cout << "Iter after removing K: " << iter->first << " -> " << iter->second.unparse()
              << std::endl;
    std::cout << "Has K?: " << name_tree.hasName("K") << std::endl;

    // Illustrate some more advanced usage using number trees. These calls work for name trees too.

    // The safe way to populate a tree is to call insert repeatedly as above, but if you know you
    // are definitely inserting items in order, it is more efficient to insert them using
    // insertAfter, which avoids doing a binary search through the tree for each insertion. Note
    // that if you don't insert items in order using this method, you will create an invalid tree.
    auto number_tree = QPDFNumberTreeObjectHelper::newEmpty(qpdf);
    auto number_tree_oh = number_tree.getObjectHandle();
    example.replaceKey("/NumberTree", number_tree_oh);
    auto iter2 = number_tree.begin();
    for (int i = 7; i <= 350; i += 7) {
        iter2.insertAfter(i, QPDFObjectHandle::newString("-" + std::to_string(i) + "-"));
    }
    std::cout << "Numbers:" << std::endl;
    int n = 1;
    for (auto& i: number_tree) {
        std::cout << i.first << " -> " << i.second.getUTF8Value();
        if (n % 5) {
            std::cout << ", ";
        } else {
            std::cout << std::endl;
        }
        ++n;
    }

    // When you remove an item with an iterator, the iterator advances. This makes it possible to
    // filter while iterating. Remove all items that are multiples of 5.
    iter2 = number_tree.begin();
    while (iter2 != number_tree.end()) {
        if (iter2->first % 5 == 0) {
            iter2.remove(); // also advances
        } else {
            ++iter2;
        }
    }
    std::cout << "Numbers after filtering:" << std::endl;
    n = 1;
    for (auto& i: number_tree) {
        std::cout << i.first << " -> " << i.second.getUTF8Value();
        if (n % 5) {
            std::cout << ", ";
        } else {
            std::cout << std::endl;
        }
        ++n;
    }

    // Write to an output file
    QPDFWriter w(qpdf, outfilename);
    w.setQDFMode(true);
    w.setStaticID(true); // for testing only
    w.write();

    return 0;
}